

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O3

void pty_free(Backend *be)

{
  Pty *pty;
  long lVar1;
  
  pty = (Pty *)(be + -0x10c);
  pty_close(pty);
  del234(ptys_by_pid,pty);
  lVar1 = 0;
  do {
    if (-1 < *(int *)((long)be + lVar1 + -0x1098)) {
      del234(ptyfds,(void *)((long)be + lVar1 + -0x1098));
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x30);
  bufchain_clear((bufchain *)(be + -3));
  conf_free((Conf *)be[-0x10c].vt);
  be[-0x10c].vt = (BackendVtable *)0x0;
  if (pty != single_pty) {
    safefree(pty);
    return;
  }
  return;
}

Assistant:

static void pty_free(Backend *be)
{
    Pty *pty = container_of(be, Pty, backend);
    int i;

    pty_close(pty);

    /* Either of these may fail `not found'. That's fine with us. */
    del234(ptys_by_pid, pty);
    for (i = 0; i < 3; i++)
        if (pty->fds[i].fd >= 0)
            del234(ptyfds, &pty->fds[i]);

    bufchain_clear(&pty->output_data);

    conf_free(pty->conf);
    pty->conf = NULL;

    if (pty == single_pty) {
        /*
         * Leave this structure around in case we need to Restart
         * Session.
         */
    } else {
        sfree(pty);
    }
}